

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void ntileValueFunc(sqlite3_context *pCtx)

{
  sqlite3_context *pCtx_00;
  int iVar1;
  long *plVar2;
  i64 iRow;
  i64 iSmall;
  i64 nLarge;
  int nSize;
  NtileCtx *p;
  sqlite3_context *in_stack_ffffffffffffffc8;
  sqlite3_context *in_stack_ffffffffffffffd0;
  
  plVar2 = (long *)sqlite3_aggregate_context(in_stack_ffffffffffffffc8,0);
  if ((plVar2 != (long *)0x0) && (0 < plVar2[1])) {
    iVar1 = (int)(*plVar2 / plVar2[1]);
    if (iVar1 == 0) {
      sqlite3_result_int64(in_stack_ffffffffffffffd0,(i64)in_stack_ffffffffffffffc8);
    }
    else {
      pCtx_00 = (sqlite3_context *)plVar2[2];
      if ((long)pCtx_00 < (*plVar2 - plVar2[1] * (long)iVar1) * (long)(iVar1 + 1)) {
        sqlite3_result_int64(pCtx_00,(i64)in_stack_ffffffffffffffc8);
      }
      else {
        sqlite3_result_int64(pCtx_00,(i64)in_stack_ffffffffffffffc8);
      }
    }
  }
  return;
}

Assistant:

static void ntileValueFunc(sqlite3_context *pCtx){
  struct NtileCtx *p;
  p = (struct NtileCtx*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  if( p && p->nParam>0 ){
    int nSize = (p->nTotal / p->nParam);
    if( nSize==0 ){
      sqlite3_result_int64(pCtx, p->iRow+1);
    }else{
      i64 nLarge = p->nTotal - p->nParam*nSize;
      i64 iSmall = nLarge*(nSize+1);
      i64 iRow = p->iRow;

      assert( (nLarge*(nSize+1) + (p->nParam-nLarge)*nSize)==p->nTotal );

      if( iRow<iSmall ){
        sqlite3_result_int64(pCtx, 1 + iRow/(nSize+1));
      }else{
        sqlite3_result_int64(pCtx, 1 + nLarge + (iRow-iSmall)/nSize);
      }
    }
  }
}